

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_cpscc(m68k_info *info)

{
  long lVar1;
  uint uVar2;
  m68k_info *info_00;
  cs_m68k_op *in_RDI;
  m68k_info *unaff_retaddr;
  cs_m68k *ext;
  undefined8 in_stack_fffffffffffffff0;
  
  if ((*(uint *)&(in_RDI->br_disp).disp_size & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x39f723);
  }
  else {
    info_00 = (m68k_info *)
              build_init_op(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                            (int)((ulong)in_stack_fffffffffffffff0 >> 0x20));
    uVar2 = read_imm_16(info_00);
    lVar1 = *(long *)&(in_RDI->mem).out_disp;
    *(uint *)(lVar1 + 8) = (uVar2 & 0x2f) + *(int *)(lVar1 + 8);
    get_ea_mode_op(unaff_retaddr,in_RDI,(uint)((ulong)info_00 >> 0x20),(uint)info_00);
  }
  return;
}

Assistant:

static void d68020_cpscc(m68k_info *info)
{
	cs_m68k* ext;

	LIMIT_CPU_TYPES(info, M68020_PLUS);
	ext = build_init_op(info, M68K_INS_FSF, 1, 1);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (read_imm_16(info) & 0x2f);

	get_ea_mode_op(info, &ext->operands[0], info->ir, 1);
}